

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::~FunctionMockerBase
          (FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this)

{
  GTestMutexLock local_18;
  MutexLock l;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00184848;
  local_18.mutex_ = (MutexBase *)g_gmock_mutex;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  GTestMutexLock::~GTestMutexLock(&local_18);
  std::_Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>::~_Tuple_impl
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_>)
  ;
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }